

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Genetic.cpp
# Opt level: O2

bool Genetic::avaliate_population(void)

{
  double dVar1;
  list<std::pair<Solution_*,_double>,_std::allocator<std::pair<Solution_*,_double>_>_> *plVar2;
  
  dVar1 = max_weight;
  ticket_max = 0.0;
  plVar2 = &solutions_abi_cxx11_;
  while (plVar2 = (list<std::pair<Solution_*,_double>,_std::allocator<std::pair<Solution_*,_double>_>_>
                   *)(plVar2->
                     super__List_base<std::pair<Solution_*,_double>,_std::allocator<std::pair<Solution_*,_double>_>_>
                     )._M_impl._M_node.super__List_node_base._M_next,
        plVar2 != &solutions_abi_cxx11_) {
    ticket_max = ticket_max + (dVar1 - *(double *)(*(long *)((long)plVar2 + 0x10) + 0x18));
    *(double *)((long)plVar2 + 0x10U + 8) = ticket_max;
  }
  return (int)ticket_max != 0;
}

Assistant:

bool Genetic::avaliate_population()
{
	double last_weight = 0;
	for (auto it = solutions.begin(); it != solutions.end(); ++it)
	{
		(*it).second = (max_weight - (*it).first->weight) + last_weight;
		last_weight = (*it).second;
	}
	ticket_max = last_weight;
	if (static_cast<int>(ticket_max) == 0)
	{
		return false;
	}
	return true;
}